

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::garbageCollect(SimpSolver *this)

{
  uint *__ptr;
  ClauseAllocator to;
  ClauseAllocator local_38;
  
  local_38.ra.memory = (uint *)0x0;
  local_38.ra.sz = 0;
  local_38.ra.cap = 0;
  local_38.ra.wasted_ = 0;
  RegionAllocator<unsigned_int>::capacity
            (&local_38.ra,(this->super_Solver).ca.ra.sz - (this->super_Solver).ca.ra.wasted_);
  local_38.extra_clause_field = (this->super_Solver).ca.extra_clause_field;
  relocAll(this,&local_38);
  Solver::relocAll(&this->super_Solver,&local_38);
  if (1 < (this->super_Solver).verbosity) {
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)((this->super_Solver).ca.ra.sz << 2),(ulong)(local_38.ra.sz << 2));
  }
  (this->super_Solver).ca.extra_clause_field = local_38.extra_clause_field;
  __ptr = (this->super_Solver).ca.ra.memory;
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  (this->super_Solver).ca.ra.memory = local_38.ra.memory;
  (this->super_Solver).ca.ra.sz = local_38.ra.sz;
  (this->super_Solver).ca.ra.cap = local_38.ra.cap;
  (this->super_Solver).ca.ra.wasted_ = local_38.ra.wasted_;
  return;
}

Assistant:

void SimpSolver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    to.extra_clause_field = ca.extra_clause_field; // NOTE: this is important to keep (or lose) the extra fields.
    relocAll(to);
    Solver::relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}